

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void on_mouse_axes(float x,float y)

{
  Token *spr_00;
  Sprite *spr_1;
  Sprite *spr;
  Token *token;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  Sprite *in_stack_ffffffffffffffe8;
  
  spr_00 = get_touched_token(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  if (spr_00 != hover_token) {
    if (hover_token != (Token *)0x0) {
      in_stack_ffffffffffffffe8 = &hover_token->bot;
      anim_to((Sprite *)spr_00,(float *)in_stack_ffffffffffffffe8,
              (float)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(Interp)in_stack_ffffffffffffffe0,
              in_stack_ffffffffffffffdc);
    }
    hover_token = spr_00;
    if (hover_token != (Token *)0x0) {
      anim_to((Sprite *)hover_token,(float *)in_stack_ffffffffffffffe8,
              (float)((ulong)&hover_token->bot >> 0x20),(Interp)&hover_token->bot,
              in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

static void on_mouse_axes(float x, float y)
{
   Token *token = get_touched_token(x, y);

   if (token == hover_token)
      return;

   if (hover_token) {
      Sprite *spr = &hover_token->bot;
      anim_to(spr, &spr->opacity, 0.4, INTERP_DOUBLE_SLOW, 0.2);
   }

   hover_token = token;

   if (hover_token) {
      Sprite *spr = &hover_token->bot;
      anim_to(spr, &spr->opacity, 0.7, INTERP_FAST, 0.2);
   }
}